

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  Rep *pRVar2;
  void *pvVar3;
  undefined8 *puVar4;
  LogMessage *other;
  ulong uVar5;
  LogFinisher local_41;
  LogMessage local_40;
  
  uVar1 = this->current_size_;
  if ((int)uVar1 < 0) {
    LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_40,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_41,other);
    LogMessage::~LogMessage(&local_40);
  }
  else if ((ulong)uVar1 != 0) {
    pRVar2 = this->rep_;
    uVar5 = 0;
    do {
      pvVar3 = pRVar2->elements[uVar5];
      puVar4 = *(undefined8 **)((long)pvVar3 + 0x10);
      if (puVar4 != &fixed_address_empty_string_abi_cxx11_) {
        puVar4[1] = 0;
        *(undefined1 *)*puVar4 = 0;
      }
      uVar5 = uVar5 + 1;
      *(undefined8 *)((long)pvVar3 + 0x18) = 0;
    } while (uVar1 != uVar5);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}